

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O3

ON_SubDComponentPtr __thiscall
ON_SubDComponentIterator::NextComponent(ON_SubDComponentIterator *this)

{
  ON_SubDComponentPtr *this_00;
  Type TVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDComponentPtr OVar3;
  ulong uVar4;
  ON_SubDEdge *pOVar5;
  ON_SubDFace *pOVar6;
  
  this_00 = &this->m_cptr_current;
  TVar1 = ON_SubDComponentPtr::ComponentType(this_00);
  uVar4 = (this->m_cptr_current).m_ptr;
  if (TVar1 != Face) {
    if (TVar1 != Edge) {
      if (TVar1 != Vertex) {
        return (ON_SubDComponentPtr)uVar4;
      }
      pOVar2 = (ON_SubDVertex *)(uVar4 & 0xfffffffffffffff8);
      if (((pOVar2 != (ON_SubDVertex *)0x0) && (this->m_vertex_last != pOVar2)) &&
         (pOVar2->m_next_vertex != (ON_SubDVertex *)0x0)) {
        OVar3 = ON_SubDComponentPtr::Create(pOVar2->m_next_vertex);
        goto LAB_0061732b;
      }
      uVar4 = 0;
      this_00->m_ptr = 0;
    }
    if (uVar4 == 0) {
      pOVar5 = this->m_edge_first;
LAB_006172e1:
      if (pOVar5 != (ON_SubDEdge *)0x0) {
        OVar3 = ON_SubDComponentPtr::Create(pOVar5);
        goto LAB_0061732b;
      }
    }
    else {
      pOVar5 = (ON_SubDEdge *)(uVar4 & 0xfffffffffffffff8);
      if ((pOVar5 != (ON_SubDEdge *)0x0) && (this->m_edge_last != pOVar5)) {
        pOVar5 = pOVar5->m_next_edge;
        goto LAB_006172e1;
      }
    }
    uVar4 = 0;
    this_00->m_ptr = 0;
  }
  if (uVar4 == 0) {
    pOVar6 = this->m_face_first;
LAB_00617315:
    if (pOVar6 != (ON_SubDFace *)0x0) {
      OVar3 = ON_SubDComponentPtr::Create(pOVar6);
      goto LAB_0061732b;
    }
  }
  else {
    pOVar6 = (ON_SubDFace *)(uVar4 & 0xfffffffffffffff8);
    if ((pOVar6 != (ON_SubDFace *)0x0) && (this->m_face_last != pOVar6)) {
      pOVar6 = pOVar6->m_next_face;
      goto LAB_00617315;
    }
  }
  OVar3 = (ON_SubDComponentPtr)0;
LAB_0061732b:
  this_00->m_ptr = OVar3.m_ptr;
  return (ON_SubDComponentPtr)OVar3.m_ptr;
}

Assistant:

const class ON_SubDComponentPtr ON_SubDComponentIterator::NextComponent()
{
  switch (m_cptr_current.ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = ON_SUBD_VERTEX_POINTER(m_cptr_current.m_ptr);
      if (nullptr != vertex && vertex != m_vertex_last && nullptr != vertex->m_next_vertex)
      {
        m_cptr_current = ON_SubDComponentPtr::Create(vertex->m_next_vertex);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    // no break here

  case ON_SubDComponentPtr::Type::Edge:
    {
      if (0 == m_cptr_current.m_ptr && nullptr != m_edge_first)
      {
        // switching from vertex to edge
        m_cptr_current = ON_SubDComponentPtr::Create(m_edge_first);
        return m_cptr_current;
      }
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_cptr_current.m_ptr);
      if (nullptr != edge && edge != m_edge_last && nullptr != edge->m_next_edge )
      {
        m_cptr_current = ON_SubDComponentPtr::Create(edge->m_next_edge);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    // no break here

  case ON_SubDComponentPtr::Type::Face:
    {
      if (0 == m_cptr_current.m_ptr && nullptr != m_face_first)
      {
        // switching from edge to face
        m_cptr_current = ON_SubDComponentPtr::Create(m_face_first);
        return m_cptr_current;
      }
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(m_cptr_current.m_ptr);
      if (nullptr != face && face != m_face_last && nullptr != face->m_next_face)
      {
        m_cptr_current = ON_SubDComponentPtr::Create(face->m_next_face);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    break;

  default:
    break;
  }
  
  return m_cptr_current;
}